

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Slider.cxx
# Opt level: O0

void __thiscall
Fl_Hor_Value_Slider::Fl_Hor_Value_Slider(Fl_Hor_Value_Slider *this,int X,int Y,int W,int H,char *l)

{
  char *l_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Hor_Value_Slider *this_local;
  
  Fl_Value_Slider::Fl_Value_Slider(&this->super_Fl_Value_Slider,X,Y,W,H,l);
  (this->super_Fl_Value_Slider).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Hor_Value_Slider_002edee8;
  Fl_Widget::type((Fl_Widget *)this,'\x01');
  return;
}

Assistant:

Fl_Hor_Value_Slider::Fl_Hor_Value_Slider(int X,int Y,int W,int H,const char *l)
: Fl_Value_Slider(X,Y,W,H,l) {
  type(FL_HOR_SLIDER);
}